

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_scan.hpp
# Opt level: O2

void __thiscall
duckdb::AlpRDScanState<float>::Skip
          (AlpRDScanState<float> *this,ColumnSegment *col_segment,idx_t skip_count)

{
  ulong uVar1;
  bool bVar2;
  
  if ((this->total_value_count != 0) && (uVar1 = this->total_value_count & 0x3ff, uVar1 != 0)) {
    uVar1 = 0x400 - uVar1;
    if (skip_count < uVar1) {
      uVar1 = skip_count;
    }
    ScanVector<unsigned_int,true>(this,(uint *)0x0,uVar1);
    skip_count = skip_count - uVar1;
  }
  uVar1 = skip_count >> 10;
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    SkipVector(this);
  }
  if ((skip_count & 0x3ff) != 0) {
    ScanVector<unsigned_int,true>(this,(uint *)0x0,skip_count & 0x3ff);
    return;
  }
  return;
}

Assistant:

void Skip(ColumnSegment &col_segment, idx_t skip_count) {
		if (total_value_count != 0 && !VectorFinished()) {
			// Finish skipping the current vector
			idx_t to_skip = MinValue<idx_t>(skip_count, LeftInVector());
			ScanVector<EXACT_TYPE, true>(nullptr, to_skip);
			skip_count -= to_skip;
		}
		// Figure out how many entire vectors we can skip
		// For these vectors, we don't even need to process the metadata or values
		idx_t vectors_to_skip = skip_count / AlpRDConstants::ALP_VECTOR_SIZE;
		for (idx_t i = 0; i < vectors_to_skip; i++) {
			SkipVector();
		}
		skip_count -= AlpRDConstants::ALP_VECTOR_SIZE * vectors_to_skip;
		if (skip_count == 0) {
			return;
		}
		// For the last vector that this skip (partially) touches, we do need to
		// load the metadata and values into the vector_state because
		// we don't know exactly how many they are
		ScanVector<EXACT_TYPE, true>(nullptr, skip_count);
	}